

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_server_transporter.cpp
# Opt level: O0

int __thiscall PipelineServerTransporter::pipe(PipelineServerTransporter *this,int *__pipedes)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  undefined8 uVar4;
  string *in_RDX;
  undefined1 local_a18 [4];
  int r;
  uv_fs_t req;
  size_t local_850;
  size_t len;
  char tmp [2048];
  string fullName;
  string *err_local;
  string *name_local;
  PipelineServerTransporter *this_local;
  
  puVar2 = uv_default_loop();
  (this->super_Transporter).loop = puVar2;
  std::__cxx11::string::string((string *)(tmp + 0x7f8));
  local_850 = 0x800;
  uv_os_tmpdir((char *)&len,&local_850);
  std::__cxx11::string::operator=((string *)(tmp + 0x7f8),(char *)&len);
  std::__cxx11::string::append(tmp + 0x7f8);
  std::__cxx11::string::append((string *)(tmp + 0x7f8));
  pcVar3 = (char *)std::__cxx11::string::c_str();
  uv_fs_unlink((uv_loop_t *)0x0,(uv_fs_t *)local_a18,pcVar3,(uv_fs_cb)0x0);
  uv_fs_req_cleanup((uv_fs_t *)local_a18);
  (this->uvServer).data = this;
  uv_pipe_init((this->super_Transporter).loop,&this->uvServer,0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar1 = uv_pipe_bind(&this->uvServer,pcVar3);
  if (iVar1 == 0) {
    iVar1 = uv_listen((uv_stream_t *)&this->uvServer,0x80,onPipeConnectionCB);
    if (iVar1 == 0) {
      Transporter::StartEventLoop(&this->super_Transporter);
      this_local._7_1_ = 1;
    }
    else {
      pcVar3 = uv_err_name(iVar1);
      std::__cxx11::string::operator=(in_RDX,pcVar3);
      this_local._7_1_ = 0;
    }
  }
  else {
    pcVar3 = uv_err_name(iVar1);
    std::__cxx11::string::operator=(in_RDX,pcVar3);
    this_local._7_1_ = 0;
  }
  uVar4 = std::__cxx11::string::~string((string *)(tmp + 0x7f8));
  return (int)CONCAT71((int7)((ulong)uVar4 >> 8),this_local._7_1_);
}

Assistant:

bool PipelineServerTransporter::pipe(const std::string& name, std::string& err) {
	loop = uv_default_loop();
	std::string fullName;
#ifdef _WIN32
	{
		fullName = "\\\\.\\pipe\\emmylua-";
		fullName.append(name);
	}
#else
    {
		char tmp[2048];
		size_t len = sizeof(tmp);
		uv_os_tmpdir(tmp, &len);
		fullName = tmp;
		fullName.append("/");
		fullName.append(name);
        uv_fs_t req;
        uv_fs_unlink(nullptr, &req, fullName.c_str(), nullptr);
        uv_fs_req_cleanup(&req);
    }
#endif
	uvServer.data = this;
	uv_pipe_init(loop, &uvServer, 0);
	int r = uv_pipe_bind(&uvServer, fullName.c_str());
	if (r) {
		err = uv_err_name(r);
		return false;
	}
	r = uv_listen((uv_stream_t*)&uvServer, 128, onPipeConnectionCB);
	if (r) {
		err = uv_err_name(r);
		return false;
	}
	StartEventLoop();
	return true;
}